

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O1

uint64_t yactfr::internal::anon_unknown_0::readFlUIntLe53At0(uint8_t *buf)

{
  return CONCAT44((uint)buf[4] | (uint)buf[5] << 8 | (uint)buf[6] << 0x10,
                  (uint)buf[2] << 0x10 | (uint)buf[3] << 0x18) & 0x1fffffffffffff |
         (ulong)buf[1] << 8 | (ulong)*buf;
}

Assistant:

std::uint64_t readFlUIntLe53At0(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[6];
    res <<= 8;
    res |= buf[5];
    res <<= 8;
    res |= buf[4];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[1];
    res <<= 8;
    res |= buf[0];
    res &= UINT64_C(0x1fffffffffffff);
    return res;
}